

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall
CVmConsole::read_event_script
          (CVmConsole *this,int *evt,char *buf,size_t buflen,int *filter,int filter_cnt,
          unsigned_long *attrs)

{
  int *piVar1;
  osfildef *fp;
  int iVar2;
  uint uVar3;
  script_stack_entry *psVar4;
  ulong uVar5;
  CVmConsole *this_00;
  ulong uVar6;
  
  psVar4 = this->script_sp_;
  if ((psVar4 != (script_stack_entry *)0x0) && (psVar4->event_script != 0)) {
    uVar6 = (ulong)(uint)filter_cnt;
    if (filter_cnt < 1) {
      uVar6 = 0;
    }
    do {
      fp = psVar4->fp;
      while (this_00 = this, iVar2 = read_script_event_type(this,evt,attrs), iVar2 != 0) {
        if (filter == (int *)0x0) {
LAB_0023ad55:
          if (buf == (char *)0x0) {
            skip_script_line(this_00,fp);
            return 1;
          }
          iVar2 = read_script_param(this_00,buf,buflen,fp);
          if (iVar2 == 0) {
            return 0;
          }
          if (*evt != 1) {
            return 1;
          }
          iVar2 = strcmp(buf,"[enter]");
          if (iVar2 != 0) {
            iVar2 = strcmp(buf,"[tab]");
            if (iVar2 == 0) {
              buf[0] = '\t';
              buf[1] = '\0';
              return 1;
            }
            iVar2 = strcmp(buf,"[space]");
            if (iVar2 != 0) {
              return 1;
            }
            buf[0] = ' ';
            buf[1] = '\0';
            return 1;
          }
          buf[0] = '\n';
          buf[1] = '\0';
          return 1;
        }
        uVar5 = 0;
        while (uVar6 != uVar5) {
          piVar1 = filter + uVar5;
          uVar5 = uVar5 + 1;
          if (*piVar1 == *evt) goto LAB_0023ad55;
        }
        skip_script_line(this_00,fp);
      }
      uVar3 = close_script_file(this);
      (*this->_vptr_CVmConsole[4])(this,(ulong)uVar3);
      psVar4 = this->script_sp_;
    } while (psVar4 != (script_stack_entry *)0x0);
  }
  return 0;
}

Assistant:

int CVmConsole::read_event_script(VMG_ int *evt, char *buf, size_t buflen,
                                  const int *filter, int filter_cnt,
                                  unsigned long *attrs)
{
    /* 
     *   if we're not reading a script, or it's not an event script, skip
     *   this 
     */
    if (script_sp_ == 0 || !script_sp_->event_script)
        return FALSE;

    /* get the script file */
    osfildef *fp = script_sp_->fp;

    /* keep going until we find something */
    for (;;)
    {
        /* read the next event */
        if (!read_script_event_type(evt, attrs))
        {
            /* end of the script - close it */
            set_more_state(close_script_file(vmg0_));

            /* if there's no more script file, there's no event */
            if (script_sp_ == 0)
                return FALSE;

            /* go back for the next event */
            fp = script_sp_->fp;
            continue;
        }

        /* if it's not in the filter list, skip it */
        if (filter != 0)
        {
            int i, found;

            /* look for a match in our filter list */
            for (i = 0, found = FALSE ; i < filter_cnt ; ++i)
            {
                if (filter[i] == *evt)
                {
                    found = TRUE;
                    break;
                }
            }

            /* if we didn't find it, skip this line */
            if (!found)
            {
                skip_script_line(fp);
                continue;
            }
        }

        /* if there's a buffer, read the rest of the line */
        if (buf != 0)
        {
            /* read the parameter into the buffer, and return the result */
            if (!read_script_param(buf, buflen, fp))
                return FALSE;

            /* if this is an OS_EVT_KEY event, translate special keys */
            if (*evt == OS_EVT_KEY)
            {
                if (strcmp(buf, "[enter]") == 0)
                    strcpy(buf, "\n");
                else if (strcmp(buf, "[tab]") == 0)
                    strcpy(buf, "\t");
                else if (strcmp(buf, "[space]") == 0)
                    strcpy(buf, " ");
            }
        }
        else
        {
            /* no result buffer - just skip anything left on the line */
            skip_script_line(fp);
        }

        /* success */
        return TRUE;
    }
}